

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx_functor::binary_op_rpow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_rpow op;
  __m256 pow2n_1;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_3;
  __m256i imm0_3;
  __m256 fx_1;
  __m256 tmp_3;
  __m256 y_2;
  __m256 z_1;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_2;
  __m256i imm0_2;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_2;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_5;
  v4si emm0_1;
  v4sf fx_2;
  v4sf tmp_5;
  v4sf y_4;
  v4sf z_2;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_4;
  v4si emm0;
  int local_4284;
  int local_4218;
  undefined8 *local_4208;
  uint *local_4200;
  undefined8 *local_41f8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  float local_4020;
  float fStack_401c;
  float fStack_4018;
  float fStack_4014;
  float fStack_4010;
  float fStack_400c;
  float fStack_4008;
  float local_4000;
  float fStack_3ffc;
  float fStack_3ff8;
  float fStack_3ff4;
  float fStack_3ff0;
  float fStack_3fec;
  float fStack_3fe8;
  undefined4 uStack_3fe4;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined1 local_3f40 [8];
  float fStack_3f38;
  float fStack_3f34;
  float fStack_3f30;
  float fStack_3f2c;
  float fStack_3f28;
  undefined4 uStack_3f24;
  undefined1 local_3f00 [8];
  float fStack_3ef8;
  float fStack_3ef4;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  float local_3e60;
  float fStack_3e5c;
  float fStack_3e58;
  float fStack_3e54;
  float fStack_3e50;
  float fStack_3e4c;
  float fStack_3e48;
  float local_3e00;
  float fStack_3dfc;
  float fStack_3df8;
  float fStack_3df4;
  float fStack_3df0;
  float fStack_3dec;
  float fStack_3de8;
  float fStack_3de4;
  undefined1 local_3d60 [8];
  float fStack_3d58;
  float fStack_3d54;
  float fStack_3d50;
  float fStack_3d4c;
  float fStack_3d48;
  float fStack_3d44;
  undefined1 local_3ce0 [8];
  float fStack_3cd8;
  float fStack_3cd4;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined1 local_3c60 [8];
  float fStack_3c58;
  float fStack_3c54;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  float local_3c40;
  float fStack_3c3c;
  float fStack_3c38;
  float fStack_3c34;
  float fStack_3c30;
  float fStack_3c2c;
  float fStack_3c28;
  float fStack_3c24;
  float local_3c00;
  float fStack_3bfc;
  float fStack_3bf8;
  float fStack_3bf4;
  float fStack_3bf0;
  float fStack_3bec;
  float fStack_3be8;
  float fStack_3be4;
  float local_3be0;
  float fStack_3bdc;
  float fStack_3bd8;
  float fStack_3bd4;
  float fStack_3bd0;
  float fStack_3bcc;
  float fStack_3bc8;
  float fStack_3bc4;
  float local_3ba0;
  float fStack_3b9c;
  float fStack_3b98;
  float fStack_3b94;
  float fStack_3b90;
  float fStack_3b8c;
  float fStack_3b88;
  float fStack_3b84;
  float local_38a0;
  float fStack_389c;
  float fStack_3898;
  float fStack_3894;
  float fStack_3890;
  float fStack_388c;
  float fStack_3888;
  float local_2f40;
  float fStack_2f3c;
  float fStack_2f38;
  float fStack_2f34;
  float fStack_2f30;
  float fStack_2f2c;
  float fStack_2f28;
  float local_2c60;
  float fStack_2c5c;
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float fStack_2c44;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  undefined4 uStack_2624;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [8];
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2540 [8];
  float fStack_2538;
  float fStack_2534;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_23a0 [8];
  float fStack_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  undefined1 local_2320 [8];
  float fStack_2318;
  float fStack_2314;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined1 local_22a0 [8];
  float fStack_2298;
  float fStack_2294;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  float local_2280;
  float fStack_227c;
  float fStack_2278;
  float fStack_2274;
  float fStack_2270;
  float fStack_226c;
  float fStack_2268;
  float fStack_2264;
  float local_2240;
  float fStack_223c;
  float fStack_2238;
  float fStack_2234;
  float fStack_2230;
  float fStack_222c;
  float fStack_2228;
  float fStack_2224;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float fStack_2204;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  float fStack_21d0;
  float fStack_21cc;
  float fStack_21c8;
  float fStack_21c4;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_e00;
  undefined8 uStack_df8;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float local_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c30;
  undefined8 uStack_c28;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a60;
  undefined8 uStack_a58;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  
  local_4208 = in_RDX;
  local_4200 = in_RSI;
  local_41f8 = in_RDI;
  if (in_R8D == 8) {
    for (local_4218 = 0; local_4218 < in_ECX; local_4218 = local_4218 + 1) {
      uVar1 = *local_4200;
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
      uStack_40b0 = auVar6._0_8_;
      uStack_40a8 = auVar6._8_8_;
      auVar70._16_8_ = uStack_40b0;
      auVar70._0_16_ = auVar5;
      auVar70._24_8_ = uStack_40a8;
      auVar69._16_8_ = uStack_40b0;
      auVar69._0_16_ = auVar5;
      auVar69._24_8_ = uStack_40a8;
      auVar3 = vcmpps_avx(auVar69,ZEXT1632(ZEXT816(0)),2);
      auVar8._8_8_ = 0x80000000800000;
      auVar8._0_8_ = 0x80000000800000;
      auVar8._16_8_ = 0x80000000800000;
      auVar8._24_8_ = 0x80000000800000;
      auVar7 = vmaxps_avx(auVar70,auVar8);
      auVar5 = vpsrld_avx(auVar7._0_16_,ZEXT416(0x17));
      auVar6 = vpsrld_avx(auVar7._16_16_,ZEXT416(0x17));
      auVar35._8_8_ = 0x807fffff807fffff;
      auVar35._0_8_ = 0x807fffff807fffff;
      auVar35._16_8_ = 0x807fffff807fffff;
      auVar35._24_8_ = 0x807fffff807fffff;
      auVar7 = vandps_avx(auVar7,auVar35);
      auVar41._8_8_ = 0x3f0000003f000000;
      auVar41._0_8_ = 0x3f0000003f000000;
      auVar41._16_8_ = 0x3f0000003f000000;
      auVar41._24_8_ = 0x3f0000003f000000;
      auVar8 = vorps_avx(auVar7,auVar41);
      auVar44._8_8_ = 0x7f0000007f;
      auVar44._0_8_ = 0x7f0000007f;
      auVar5 = vpsubd_avx(auVar5,auVar44);
      auVar43._8_8_ = 0x7f0000007f;
      auVar43._0_8_ = 0x7f0000007f;
      auVar6 = vpsubd_avx(auVar6,auVar43);
      local_e00 = auVar6._0_8_;
      uStack_df8 = auVar6._8_8_;
      auVar42._16_8_ = local_e00;
      auVar42._0_16_ = auVar5;
      auVar42._24_8_ = uStack_df8;
      auVar7 = vcvtdq2ps_avx(auVar42);
      local_21e0 = auVar7._0_4_;
      fStack_21dc = auVar7._4_4_;
      fStack_21d8 = auVar7._8_4_;
      fStack_21d4 = auVar7._12_4_;
      fStack_21d0 = auVar7._16_4_;
      fStack_21cc = auVar7._20_4_;
      fStack_21c8 = auVar7._24_4_;
      fStack_21c4 = auVar7._28_4_;
      local_2320._4_4_ = fStack_21dc + 1.0;
      local_2320._0_4_ = local_21e0 + 1.0;
      fStack_2318 = fStack_21d8 + 1.0;
      fStack_2314 = fStack_21d4 + 1.0;
      uStack_2310._0_4_ = fStack_21d0 + 1.0;
      uStack_2310._4_4_ = fStack_21cc + 1.0;
      uStack_2308._0_4_ = fStack_21c8 + 1.0;
      uStack_2308._4_4_ = fStack_21c4 + 1.0;
      auVar32 = _local_2320;
      auVar4 = vcmpps_avx(auVar8,_DAT_01f8e620,1);
      auVar7 = vandps_avx(auVar8,auVar4);
      auVar33._8_8_ = 0x3f8000003f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar33._16_8_ = 0x3f8000003f800000;
      auVar33._24_8_ = 0x3f8000003f800000;
      auVar8 = vsubps_avx(auVar8,auVar33);
      uStack_2308 = auVar32._24_8_;
      auVar34._8_8_ = 0x3f8000003f800000;
      auVar34._0_8_ = 0x3f8000003f800000;
      auVar34._16_8_ = 0x3f8000003f800000;
      auVar34._24_8_ = 0x3f8000003f800000;
      auVar4 = vandps_avx(auVar34,auVar4);
      auVar32._16_8_ = uStack_2310;
      auVar32._0_16_ = _local_2320;
      auVar32._24_8_ = uStack_2308;
      auVar4 = vsubps_avx(auVar32,auVar4);
      local_2220 = auVar8._0_4_;
      fStack_221c = auVar8._4_4_;
      fStack_2218 = auVar8._8_4_;
      fStack_2214 = auVar8._12_4_;
      fStack_2210 = auVar8._16_4_;
      fStack_220c = auVar8._20_4_;
      fStack_2208 = auVar8._24_4_;
      fStack_2204 = auVar8._28_4_;
      local_2240 = auVar7._0_4_;
      fStack_223c = auVar7._4_4_;
      fStack_2238 = auVar7._8_4_;
      fStack_2234 = auVar7._12_4_;
      fStack_2230 = auVar7._16_4_;
      fStack_222c = auVar7._20_4_;
      fStack_2228 = auVar7._24_4_;
      fStack_2224 = auVar7._28_4_;
      local_2220 = local_2220 + local_2240;
      fStack_221c = fStack_221c + fStack_223c;
      fStack_2218 = fStack_2218 + fStack_2238;
      fStack_2214 = fStack_2214 + fStack_2234;
      fStack_2210 = fStack_2210 + fStack_2230;
      fStack_220c = fStack_220c + fStack_222c;
      fStack_2208 = fStack_2208 + fStack_2228;
      fStack_2204 = fStack_2204 + fStack_2224;
      local_1ee0 = auVar4._0_4_;
      fStack_1edc = auVar4._4_4_;
      fStack_1ed8 = auVar4._8_4_;
      fStack_1ed4 = auVar4._12_4_;
      fStack_1ed0 = auVar4._16_4_;
      fStack_1ecc = auVar4._20_4_;
      fStack_1ec8 = auVar4._24_4_;
      local_23a0._4_4_ =
           fStack_1edc * -0.00021219444 +
           ((((((((fStack_221c * 0.070376836 + -0.1151461) * fStack_221c + 0.116769984) *
                 fStack_221c + -0.12420141) * fStack_221c + 0.14249323) * fStack_221c + -0.16668057)
              * fStack_221c + 0.20000714) * fStack_221c + -0.24999994) * fStack_221c + 0.3333333) *
           fStack_221c * fStack_221c * fStack_221c;
      local_23a0._0_4_ =
           local_1ee0 * -0.00021219444 +
           ((((((((local_2220 * 0.070376836 + -0.1151461) * local_2220 + 0.116769984) * local_2220 +
                -0.12420141) * local_2220 + 0.14249323) * local_2220 + -0.16668057) * local_2220 +
             0.20000714) * local_2220 + -0.24999994) * local_2220 + 0.3333333) * local_2220 *
           local_2220 * local_2220;
      fStack_2398 = fStack_1ed8 * -0.00021219444 +
                    ((((((((fStack_2218 * 0.070376836 + -0.1151461) * fStack_2218 + 0.116769984) *
                          fStack_2218 + -0.12420141) * fStack_2218 + 0.14249323) * fStack_2218 +
                       -0.16668057) * fStack_2218 + 0.20000714) * fStack_2218 + -0.24999994) *
                     fStack_2218 + 0.3333333) * fStack_2218 * fStack_2218 * fStack_2218;
      fStack_2394 = fStack_1ed4 * -0.00021219444 +
                    ((((((((fStack_2214 * 0.070376836 + -0.1151461) * fStack_2214 + 0.116769984) *
                          fStack_2214 + -0.12420141) * fStack_2214 + 0.14249323) * fStack_2214 +
                       -0.16668057) * fStack_2214 + 0.20000714) * fStack_2214 + -0.24999994) *
                     fStack_2214 + 0.3333333) * fStack_2214 * fStack_2214 * fStack_2214;
      fStack_2390 = fStack_1ed0 * -0.00021219444 +
                    ((((((((fStack_2210 * 0.070376836 + -0.1151461) * fStack_2210 + 0.116769984) *
                          fStack_2210 + -0.12420141) * fStack_2210 + 0.14249323) * fStack_2210 +
                       -0.16668057) * fStack_2210 + 0.20000714) * fStack_2210 + -0.24999994) *
                     fStack_2210 + 0.3333333) * fStack_2210 * fStack_2210 * fStack_2210;
      fStack_238c = fStack_1ecc * -0.00021219444 +
                    ((((((((fStack_220c * 0.070376836 + -0.1151461) * fStack_220c + 0.116769984) *
                          fStack_220c + -0.12420141) * fStack_220c + 0.14249323) * fStack_220c +
                       -0.16668057) * fStack_220c + 0.20000714) * fStack_220c + -0.24999994) *
                     fStack_220c + 0.3333333) * fStack_220c * fStack_220c * fStack_220c;
      fStack_2388 = fStack_1ec8 * -0.00021219444 +
                    ((((((((fStack_2208 * 0.070376836 + -0.1151461) * fStack_2208 + 0.116769984) *
                          fStack_2208 + -0.12420141) * fStack_2208 + 0.14249323) * fStack_2208 +
                       -0.16668057) * fStack_2208 + 0.20000714) * fStack_2208 + -0.24999994) *
                     fStack_2208 + 0.3333333) * fStack_2208 * fStack_2208 * fStack_2208;
      fStack_2384 = fStack_2204 + 0.3333333 + -0.00021219444;
      auVar37._4_4_ = fStack_221c * fStack_221c * 0.5;
      auVar37._0_4_ = local_2220 * local_2220 * 0.5;
      auVar37._8_4_ = fStack_2218 * fStack_2218 * 0.5;
      auVar37._12_4_ = fStack_2214 * fStack_2214 * 0.5;
      auVar37._16_4_ = fStack_2210 * fStack_2210 * 0.5;
      auVar37._20_4_ = fStack_220c * fStack_220c * 0.5;
      auVar37._24_4_ = fStack_2208 * fStack_2208 * 0.5;
      auVar37._28_4_ = fStack_2204;
      auVar7 = vsubps_avx(_local_23a0,auVar37);
      local_2280 = auVar7._0_4_;
      fStack_227c = auVar7._4_4_;
      fStack_2278 = auVar7._8_4_;
      fStack_2274 = auVar7._12_4_;
      fStack_2270 = auVar7._16_4_;
      fStack_226c = auVar7._20_4_;
      fStack_2268 = auVar7._24_4_;
      fStack_2264 = auVar7._28_4_;
      local_22a0._4_4_ = fStack_1edc * 0.6933594 + fStack_221c + fStack_227c;
      local_22a0._0_4_ = local_1ee0 * 0.6933594 + local_2220 + local_2280;
      fStack_2298 = fStack_1ed8 * 0.6933594 + fStack_2218 + fStack_2278;
      fStack_2294 = fStack_1ed4 * 0.6933594 + fStack_2214 + fStack_2274;
      uStack_2290._0_4_ = fStack_1ed0 * 0.6933594 + fStack_2210 + fStack_2270;
      uStack_2290._4_4_ = fStack_1ecc * 0.6933594 + fStack_220c + fStack_226c;
      uStack_2288._0_4_ = fStack_1ec8 * 0.6933594 + fStack_2208 + fStack_2268;
      uStack_2288._4_4_ = fStack_2204 + fStack_2264 + 0.6933594;
      auVar7 = _local_22a0;
      uStack_2288 = auVar7._24_8_;
      auVar40._16_8_ = uStack_2290;
      auVar40._0_16_ = _local_22a0;
      auVar40._24_8_ = uStack_2288;
      auVar7 = vorps_avx(auVar40,auVar3);
      local_2640 = (float)*local_41f8;
      fStack_263c = (float)((ulong)*local_41f8 >> 0x20);
      fStack_2638 = (float)local_41f8[1];
      fStack_2634 = (float)((ulong)local_41f8[1] >> 0x20);
      fStack_2630 = (float)local_41f8[2];
      fStack_262c = (float)((ulong)local_41f8[2] >> 0x20);
      fStack_2628 = (float)local_41f8[3];
      uStack_2624 = (undefined4)((ulong)local_41f8[3] >> 0x20);
      local_2660 = auVar7._0_4_;
      fStack_265c = auVar7._4_4_;
      fStack_2658 = auVar7._8_4_;
      fStack_2654 = auVar7._12_4_;
      fStack_2650 = auVar7._16_4_;
      fStack_264c = auVar7._20_4_;
      fStack_2648 = auVar7._24_4_;
      local_2540._4_4_ = fStack_263c * fStack_265c;
      local_2540._0_4_ = local_2640 * local_2660;
      fStack_2538 = fStack_2638 * fStack_2658;
      fStack_2534 = fStack_2634 * fStack_2654;
      uStack_2530._0_4_ = fStack_2630 * fStack_2650;
      uStack_2530._4_4_ = fStack_262c * fStack_264c;
      uStack_2528._0_4_ = fStack_2628 * fStack_2648;
      uStack_2528._4_4_ = uStack_2624;
      auVar7 = _local_2540;
      uStack_2528 = auVar7._24_8_;
      auVar3._16_8_ = uStack_2530;
      auVar3._0_16_ = _local_2540;
      auVar3._24_8_ = uStack_2528;
      auVar7._8_8_ = 0x42b0c0a542b0c0a5;
      auVar7._0_8_ = 0x42b0c0a542b0c0a5;
      auVar7._16_8_ = 0x42b0c0a542b0c0a5;
      auVar7._24_8_ = 0x42b0c0a542b0c0a5;
      auVar7 = vminps_avx(auVar3,auVar7);
      auVar4._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar7,auVar4);
      local_1580 = auVar4._0_4_;
      fStack_157c = auVar4._4_4_;
      fStack_1578 = auVar4._8_4_;
      fStack_1574 = auVar4._12_4_;
      fStack_1570 = auVar4._16_4_;
      fStack_156c = auVar4._20_4_;
      fStack_1568 = auVar4._24_4_;
      local_2580._4_4_ = fStack_157c * 1.442695 + 0.5;
      local_2580._0_4_ = local_1580 * 1.442695 + 0.5;
      fStack_2578 = fStack_1578 * 1.442695 + 0.5;
      fStack_2574 = fStack_1574 * 1.442695 + 0.5;
      fStack_2570 = fStack_1570 * 1.442695 + 0.5;
      fStack_256c = fStack_156c * 1.442695 + 0.5;
      fStack_2568 = fStack_1568 * 1.442695 + 0.5;
      uStack_2564 = 0x3ff8aa3b;
      auVar3 = vroundps_avx(_local_2580,1);
      auVar7 = vcmpps_avx(_local_2580,auVar3,1);
      auVar36._8_8_ = 0x3f8000003f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar36._16_8_ = 0x3f8000003f800000;
      auVar36._24_8_ = 0x3f8000003f800000;
      auVar7 = vandps_avx(auVar7,auVar36);
      auVar7 = vsubps_avx(auVar3,auVar7);
      local_12a0 = auVar7._0_4_;
      fStack_129c = auVar7._4_4_;
      fStack_1298 = auVar7._8_4_;
      fStack_1294 = auVar7._12_4_;
      fStack_1290 = auVar7._16_4_;
      fStack_128c = auVar7._20_4_;
      fStack_1288 = auVar7._24_4_;
      fStack_1284 = auVar7._28_4_;
      auVar39._4_4_ = fStack_129c * 0.6933594;
      auVar39._0_4_ = local_12a0 * 0.6933594;
      auVar39._8_4_ = fStack_1298 * 0.6933594;
      auVar39._12_4_ = fStack_1294 * 0.6933594;
      auVar39._16_4_ = fStack_1290 * 0.6933594;
      auVar39._20_4_ = fStack_128c * 0.6933594;
      auVar39._24_4_ = fStack_1288 * 0.6933594;
      auVar39._28_4_ = fStack_1284;
      auVar7 = vsubps_avx(auVar4,auVar39);
      auVar38._4_4_ = fStack_129c * -0.00021219444;
      auVar38._0_4_ = local_12a0 * -0.00021219444;
      auVar38._8_4_ = fStack_1298 * -0.00021219444;
      auVar38._12_4_ = fStack_1294 * -0.00021219444;
      auVar38._16_4_ = fStack_1290 * -0.00021219444;
      auVar38._20_4_ = fStack_128c * -0.00021219444;
      auVar38._24_4_ = fStack_1288 * -0.00021219444;
      auVar38._28_4_ = fStack_1284;
      auVar7 = vsubps_avx(auVar7,auVar38);
      local_2440 = auVar7._0_4_;
      fStack_243c = auVar7._4_4_;
      fStack_2438 = auVar7._8_4_;
      fStack_2434 = auVar7._12_4_;
      fStack_2430 = auVar7._16_4_;
      fStack_242c = auVar7._20_4_;
      fStack_2428 = auVar7._24_4_;
      fStack_2424 = auVar7._28_4_;
      local_25a0 = CONCAT44((int)fStack_129c,(int)local_12a0);
      uStack_2598 = CONCAT44((int)fStack_1294,(int)fStack_1298);
      uStack_2590 = CONCAT44((int)fStack_128c,(int)fStack_1290);
      uStack_2588 = CONCAT44((int)fStack_1284,(int)fStack_1288);
      auVar9._8_8_ = uStack_2598;
      auVar9._0_8_ = local_25a0;
      auVar5._8_8_ = 0x7f0000007f;
      auVar5._0_8_ = 0x7f0000007f;
      auVar5 = vpaddd_avx(auVar9,auVar5);
      auVar10._8_8_ = uStack_2588;
      auVar10._0_8_ = uStack_2590;
      auVar6._8_8_ = 0x7f0000007f;
      auVar6._0_8_ = 0x7f0000007f;
      auVar6 = vpaddd_avx(auVar10,auVar6);
      auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
      auVar6 = vpslld_avx(auVar6,ZEXT416(0x17));
      local_24a0 = auVar5._0_4_;
      fStack_249c = auVar5._4_4_;
      fStack_2498 = auVar5._8_4_;
      fStack_2494 = auVar5._12_4_;
      fStack_2490 = auVar6._0_4_;
      fStack_248c = auVar6._4_4_;
      fStack_2488 = auVar6._8_4_;
      local_2600 = CONCAT44(((((((fStack_243c * 0.00019875691 + 0.0013981999) * fStack_243c +
                                0.008333452) * fStack_243c + 0.041665796) * fStack_243c + 0.16666666
                              ) * fStack_243c + 0.5) * fStack_243c * fStack_243c + fStack_243c + 1.0
                            ) * fStack_249c,
                            ((((((local_2440 * 0.00019875691 + 0.0013981999) * local_2440 +
                                0.008333452) * local_2440 + 0.041665796) * local_2440 + 0.16666666)
                              * local_2440 + 0.5) * local_2440 * local_2440 + local_2440 + 1.0) *
                            local_24a0);
      uStack_25f8 = CONCAT44(((((((fStack_2434 * 0.00019875691 + 0.0013981999) * fStack_2434 +
                                 0.008333452) * fStack_2434 + 0.041665796) * fStack_2434 +
                               0.16666666) * fStack_2434 + 0.5) * fStack_2434 * fStack_2434 +
                              fStack_2434 + 1.0) * fStack_2494,
                             ((((((fStack_2438 * 0.00019875691 + 0.0013981999) * fStack_2438 +
                                 0.008333452) * fStack_2438 + 0.041665796) * fStack_2438 +
                               0.16666666) * fStack_2438 + 0.5) * fStack_2438 * fStack_2438 +
                              fStack_2438 + 1.0) * fStack_2498);
      uStack_25f0 = CONCAT44(((((((fStack_242c * 0.00019875691 + 0.0013981999) * fStack_242c +
                                 0.008333452) * fStack_242c + 0.041665796) * fStack_242c +
                               0.16666666) * fStack_242c + 0.5) * fStack_242c * fStack_242c +
                              fStack_242c + 1.0) * fStack_248c,
                             ((((((fStack_2430 * 0.00019875691 + 0.0013981999) * fStack_2430 +
                                 0.008333452) * fStack_2430 + 0.041665796) * fStack_2430 +
                               0.16666666) * fStack_2430 + 0.5) * fStack_2430 * fStack_2430 +
                              fStack_2430 + 1.0) * fStack_2490);
      uStack_25e8 = CONCAT44(fStack_2424 + fStack_2424 + 1.0,
                             ((((((fStack_2428 * 0.00019875691 + 0.0013981999) * fStack_2428 +
                                 0.008333452) * fStack_2428 + 0.041665796) * fStack_2428 +
                               0.16666666) * fStack_2428 + 0.5) * fStack_2428 * fStack_2428 +
                              fStack_2428 + 1.0) * fStack_2488);
      *local_4208 = local_2600;
      local_4208[1] = uStack_25f8;
      local_4208[2] = uStack_25f0;
      local_4208[3] = uStack_25e8;
      local_41f8 = local_41f8 + 4;
      local_4200 = local_4200 + 1;
      local_4208 = local_4208 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_4284 = 0; local_4284 + 1 < in_ECX; local_4284 = local_4284 + 2) {
      uVar1 = *local_4200;
      uVar2 = local_4200[1];
      auVar68._8_8_ = CONCAT44(uVar1,uVar1);
      auVar68._0_8_ = CONCAT44(uVar1,uVar1);
      auVar68._16_8_ = CONCAT44(uVar2,uVar2);
      auVar68._24_8_ = CONCAT44(uVar2,uVar2);
      auVar67._8_8_ = CONCAT44(uVar1,uVar1);
      auVar67._0_8_ = CONCAT44(uVar1,uVar1);
      auVar67._16_8_ = CONCAT44(uVar2,uVar2);
      auVar67._24_8_ = CONCAT44(uVar2,uVar2);
      auVar3 = vcmpps_avx(auVar67,ZEXT1632(ZEXT816(0)),2);
      auVar16._8_8_ = 0x80000000800000;
      auVar16._0_8_ = 0x80000000800000;
      auVar16._16_8_ = 0x80000000800000;
      auVar16._24_8_ = 0x80000000800000;
      auVar7 = vmaxps_avx(auVar68,auVar16);
      auVar5 = vpsrld_avx(auVar7._0_16_,ZEXT416(0x17));
      auVar6 = vpsrld_avx(auVar7._16_16_,ZEXT416(0x17));
      auVar18._8_8_ = 0x807fffff807fffff;
      auVar18._0_8_ = 0x807fffff807fffff;
      auVar18._16_8_ = 0x807fffff807fffff;
      auVar18._24_8_ = 0x807fffff807fffff;
      auVar7 = vandps_avx(auVar7,auVar18);
      auVar28._8_8_ = 0x3f0000003f000000;
      auVar28._0_8_ = 0x3f0000003f000000;
      auVar28._16_8_ = 0x3f0000003f000000;
      auVar28._24_8_ = 0x3f0000003f000000;
      auVar8 = vorps_avx(auVar7,auVar28);
      auVar31._8_8_ = 0x7f0000007f;
      auVar31._0_8_ = 0x7f0000007f;
      auVar5 = vpsubd_avx(auVar5,auVar31);
      auVar30._8_8_ = 0x7f0000007f;
      auVar30._0_8_ = 0x7f0000007f;
      auVar6 = vpsubd_avx(auVar6,auVar30);
      local_27c0 = auVar6._0_8_;
      uStack_27b8 = auVar6._8_8_;
      auVar29._16_8_ = local_27c0;
      auVar29._0_16_ = auVar5;
      auVar29._24_8_ = uStack_27b8;
      auVar7 = vcvtdq2ps_avx(auVar29);
      local_3ba0 = auVar7._0_4_;
      fStack_3b9c = auVar7._4_4_;
      fStack_3b98 = auVar7._8_4_;
      fStack_3b94 = auVar7._12_4_;
      fStack_3b90 = auVar7._16_4_;
      fStack_3b8c = auVar7._20_4_;
      fStack_3b88 = auVar7._24_4_;
      fStack_3b84 = auVar7._28_4_;
      local_3ce0._4_4_ = fStack_3b9c + 1.0;
      local_3ce0._0_4_ = local_3ba0 + 1.0;
      fStack_3cd8 = fStack_3b98 + 1.0;
      fStack_3cd4 = fStack_3b94 + 1.0;
      uStack_3cd0._0_4_ = fStack_3b90 + 1.0;
      uStack_3cd0._4_4_ = fStack_3b8c + 1.0;
      uStack_3cc8._0_4_ = fStack_3b88 + 1.0;
      uStack_3cc8._4_4_ = fStack_3b84 + 1.0;
      auVar32 = _local_3ce0;
      auVar4 = vcmpps_avx(auVar8,_DAT_01f8e620,1);
      auVar7 = vandps_avx(auVar8,auVar4);
      auVar15._8_8_ = 0x3f8000003f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      auVar15._16_8_ = 0x3f8000003f800000;
      auVar15._24_8_ = 0x3f8000003f800000;
      auVar8 = vsubps_avx(auVar8,auVar15);
      uStack_3cc8 = auVar32._24_8_;
      auVar17._8_8_ = 0x3f8000003f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      auVar17._16_8_ = 0x3f8000003f800000;
      auVar17._24_8_ = 0x3f8000003f800000;
      auVar4 = vandps_avx(auVar17,auVar4);
      auVar14._16_8_ = uStack_3cd0;
      auVar14._0_16_ = _local_3ce0;
      auVar14._24_8_ = uStack_3cc8;
      auVar4 = vsubps_avx(auVar14,auVar4);
      local_3be0 = auVar8._0_4_;
      fStack_3bdc = auVar8._4_4_;
      fStack_3bd8 = auVar8._8_4_;
      fStack_3bd4 = auVar8._12_4_;
      fStack_3bd0 = auVar8._16_4_;
      fStack_3bcc = auVar8._20_4_;
      fStack_3bc8 = auVar8._24_4_;
      fStack_3bc4 = auVar8._28_4_;
      local_3c00 = auVar7._0_4_;
      fStack_3bfc = auVar7._4_4_;
      fStack_3bf8 = auVar7._8_4_;
      fStack_3bf4 = auVar7._12_4_;
      fStack_3bf0 = auVar7._16_4_;
      fStack_3bec = auVar7._20_4_;
      fStack_3be8 = auVar7._24_4_;
      fStack_3be4 = auVar7._28_4_;
      local_3be0 = local_3be0 + local_3c00;
      fStack_3bdc = fStack_3bdc + fStack_3bfc;
      fStack_3bd8 = fStack_3bd8 + fStack_3bf8;
      fStack_3bd4 = fStack_3bd4 + fStack_3bf4;
      fStack_3bd0 = fStack_3bd0 + fStack_3bf0;
      fStack_3bcc = fStack_3bcc + fStack_3bec;
      fStack_3bc8 = fStack_3bc8 + fStack_3be8;
      fStack_3bc4 = fStack_3bc4 + fStack_3be4;
      local_38a0 = auVar4._0_4_;
      fStack_389c = auVar4._4_4_;
      fStack_3898 = auVar4._8_4_;
      fStack_3894 = auVar4._12_4_;
      fStack_3890 = auVar4._16_4_;
      fStack_388c = auVar4._20_4_;
      fStack_3888 = auVar4._24_4_;
      local_3d60._4_4_ =
           fStack_389c * -0.00021219444 +
           ((((((((fStack_3bdc * 0.070376836 + -0.1151461) * fStack_3bdc + 0.116769984) *
                 fStack_3bdc + -0.12420141) * fStack_3bdc + 0.14249323) * fStack_3bdc + -0.16668057)
              * fStack_3bdc + 0.20000714) * fStack_3bdc + -0.24999994) * fStack_3bdc + 0.3333333) *
           fStack_3bdc * fStack_3bdc * fStack_3bdc;
      local_3d60._0_4_ =
           local_38a0 * -0.00021219444 +
           ((((((((local_3be0 * 0.070376836 + -0.1151461) * local_3be0 + 0.116769984) * local_3be0 +
                -0.12420141) * local_3be0 + 0.14249323) * local_3be0 + -0.16668057) * local_3be0 +
             0.20000714) * local_3be0 + -0.24999994) * local_3be0 + 0.3333333) * local_3be0 *
           local_3be0 * local_3be0;
      fStack_3d58 = fStack_3898 * -0.00021219444 +
                    ((((((((fStack_3bd8 * 0.070376836 + -0.1151461) * fStack_3bd8 + 0.116769984) *
                          fStack_3bd8 + -0.12420141) * fStack_3bd8 + 0.14249323) * fStack_3bd8 +
                       -0.16668057) * fStack_3bd8 + 0.20000714) * fStack_3bd8 + -0.24999994) *
                     fStack_3bd8 + 0.3333333) * fStack_3bd8 * fStack_3bd8 * fStack_3bd8;
      fStack_3d54 = fStack_3894 * -0.00021219444 +
                    ((((((((fStack_3bd4 * 0.070376836 + -0.1151461) * fStack_3bd4 + 0.116769984) *
                          fStack_3bd4 + -0.12420141) * fStack_3bd4 + 0.14249323) * fStack_3bd4 +
                       -0.16668057) * fStack_3bd4 + 0.20000714) * fStack_3bd4 + -0.24999994) *
                     fStack_3bd4 + 0.3333333) * fStack_3bd4 * fStack_3bd4 * fStack_3bd4;
      fStack_3d50 = fStack_3890 * -0.00021219444 +
                    ((((((((fStack_3bd0 * 0.070376836 + -0.1151461) * fStack_3bd0 + 0.116769984) *
                          fStack_3bd0 + -0.12420141) * fStack_3bd0 + 0.14249323) * fStack_3bd0 +
                       -0.16668057) * fStack_3bd0 + 0.20000714) * fStack_3bd0 + -0.24999994) *
                     fStack_3bd0 + 0.3333333) * fStack_3bd0 * fStack_3bd0 * fStack_3bd0;
      fStack_3d4c = fStack_388c * -0.00021219444 +
                    ((((((((fStack_3bcc * 0.070376836 + -0.1151461) * fStack_3bcc + 0.116769984) *
                          fStack_3bcc + -0.12420141) * fStack_3bcc + 0.14249323) * fStack_3bcc +
                       -0.16668057) * fStack_3bcc + 0.20000714) * fStack_3bcc + -0.24999994) *
                     fStack_3bcc + 0.3333333) * fStack_3bcc * fStack_3bcc * fStack_3bcc;
      fStack_3d48 = fStack_3888 * -0.00021219444 +
                    ((((((((fStack_3bc8 * 0.070376836 + -0.1151461) * fStack_3bc8 + 0.116769984) *
                          fStack_3bc8 + -0.12420141) * fStack_3bc8 + 0.14249323) * fStack_3bc8 +
                       -0.16668057) * fStack_3bc8 + 0.20000714) * fStack_3bc8 + -0.24999994) *
                     fStack_3bc8 + 0.3333333) * fStack_3bc8 * fStack_3bc8 * fStack_3bc8;
      fStack_3d44 = fStack_3bc4 + 0.3333333 + -0.00021219444;
      auVar20._4_4_ = fStack_3bdc * fStack_3bdc * 0.5;
      auVar20._0_4_ = local_3be0 * local_3be0 * 0.5;
      auVar20._8_4_ = fStack_3bd8 * fStack_3bd8 * 0.5;
      auVar20._12_4_ = fStack_3bd4 * fStack_3bd4 * 0.5;
      auVar20._16_4_ = fStack_3bd0 * fStack_3bd0 * 0.5;
      auVar20._20_4_ = fStack_3bcc * fStack_3bcc * 0.5;
      auVar20._24_4_ = fStack_3bc8 * fStack_3bc8 * 0.5;
      auVar20._28_4_ = fStack_3bc4;
      auVar7 = vsubps_avx(_local_3d60,auVar20);
      local_3c40 = auVar7._0_4_;
      fStack_3c3c = auVar7._4_4_;
      fStack_3c38 = auVar7._8_4_;
      fStack_3c34 = auVar7._12_4_;
      fStack_3c30 = auVar7._16_4_;
      fStack_3c2c = auVar7._20_4_;
      fStack_3c28 = auVar7._24_4_;
      fStack_3c24 = auVar7._28_4_;
      local_3c60._4_4_ = fStack_389c * 0.6933594 + fStack_3bdc + fStack_3c3c;
      local_3c60._0_4_ = local_38a0 * 0.6933594 + local_3be0 + local_3c40;
      fStack_3c58 = fStack_3898 * 0.6933594 + fStack_3bd8 + fStack_3c38;
      fStack_3c54 = fStack_3894 * 0.6933594 + fStack_3bd4 + fStack_3c34;
      uStack_3c50._0_4_ = fStack_3890 * 0.6933594 + fStack_3bd0 + fStack_3c30;
      uStack_3c50._4_4_ = fStack_388c * 0.6933594 + fStack_3bcc + fStack_3c2c;
      uStack_3c48._0_4_ = fStack_3888 * 0.6933594 + fStack_3bc8 + fStack_3c28;
      uStack_3c48._4_4_ = fStack_3bc4 + fStack_3c24 + 0.6933594;
      auVar7 = _local_3c60;
      uStack_3c48 = auVar7._24_8_;
      auVar27._16_8_ = uStack_3c50;
      auVar27._0_16_ = _local_3c60;
      auVar27._24_8_ = uStack_3c48;
      auVar7 = vorps_avx(auVar27,auVar3);
      local_4000 = (float)*local_41f8;
      fStack_3ffc = (float)((ulong)*local_41f8 >> 0x20);
      fStack_3ff8 = (float)local_41f8[1];
      fStack_3ff4 = (float)((ulong)local_41f8[1] >> 0x20);
      fStack_3ff0 = (float)local_41f8[2];
      fStack_3fec = (float)((ulong)local_41f8[2] >> 0x20);
      fStack_3fe8 = (float)local_41f8[3];
      uStack_3fe4 = (undefined4)((ulong)local_41f8[3] >> 0x20);
      local_4020 = auVar7._0_4_;
      fStack_401c = auVar7._4_4_;
      fStack_4018 = auVar7._8_4_;
      fStack_4014 = auVar7._12_4_;
      fStack_4010 = auVar7._16_4_;
      fStack_400c = auVar7._20_4_;
      fStack_4008 = auVar7._24_4_;
      local_3f00._4_4_ = fStack_3ffc * fStack_401c;
      local_3f00._0_4_ = local_4000 * local_4020;
      fStack_3ef8 = fStack_3ff8 * fStack_4018;
      fStack_3ef4 = fStack_3ff4 * fStack_4014;
      uStack_3ef0._0_4_ = fStack_3ff0 * fStack_4010;
      uStack_3ef0._4_4_ = fStack_3fec * fStack_400c;
      uStack_3ee8._0_4_ = fStack_3fe8 * fStack_4008;
      uStack_3ee8._4_4_ = uStack_3fe4;
      auVar7 = _local_3f00;
      uStack_3ee8 = auVar7._24_8_;
      auVar13._16_8_ = uStack_3ef0;
      auVar13._0_16_ = _local_3f00;
      auVar13._24_8_ = uStack_3ee8;
      auVar12._8_8_ = 0x42b0c0a542b0c0a5;
      auVar12._0_8_ = 0x42b0c0a542b0c0a5;
      auVar12._16_8_ = 0x42b0c0a542b0c0a5;
      auVar12._24_8_ = 0x42b0c0a542b0c0a5;
      auVar7 = vminps_avx(auVar13,auVar12);
      auVar11._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar11._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar11._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar11._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar7,auVar11);
      local_2f40 = auVar4._0_4_;
      fStack_2f3c = auVar4._4_4_;
      fStack_2f38 = auVar4._8_4_;
      fStack_2f34 = auVar4._12_4_;
      fStack_2f30 = auVar4._16_4_;
      fStack_2f2c = auVar4._20_4_;
      fStack_2f28 = auVar4._24_4_;
      local_3f40._4_4_ = fStack_2f3c * 1.442695 + 0.5;
      local_3f40._0_4_ = local_2f40 * 1.442695 + 0.5;
      fStack_3f38 = fStack_2f38 * 1.442695 + 0.5;
      fStack_3f34 = fStack_2f34 * 1.442695 + 0.5;
      fStack_3f30 = fStack_2f30 * 1.442695 + 0.5;
      fStack_3f2c = fStack_2f2c * 1.442695 + 0.5;
      fStack_3f28 = fStack_2f28 * 1.442695 + 0.5;
      uStack_3f24 = 0x3ff8aa3b;
      auVar3 = vroundps_avx(_local_3f40,1);
      auVar7 = vcmpps_avx(_local_3f40,auVar3,1);
      auVar19._8_8_ = 0x3f8000003f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      auVar19._16_8_ = 0x3f8000003f800000;
      auVar19._24_8_ = 0x3f8000003f800000;
      auVar7 = vandps_avx(auVar7,auVar19);
      auVar7 = vsubps_avx(auVar3,auVar7);
      local_2c60 = auVar7._0_4_;
      fStack_2c5c = auVar7._4_4_;
      fStack_2c58 = auVar7._8_4_;
      fStack_2c54 = auVar7._12_4_;
      fStack_2c50 = auVar7._16_4_;
      fStack_2c4c = auVar7._20_4_;
      fStack_2c48 = auVar7._24_4_;
      fStack_2c44 = auVar7._28_4_;
      auVar22._4_4_ = fStack_2c5c * 0.6933594;
      auVar22._0_4_ = local_2c60 * 0.6933594;
      auVar22._8_4_ = fStack_2c58 * 0.6933594;
      auVar22._12_4_ = fStack_2c54 * 0.6933594;
      auVar22._16_4_ = fStack_2c50 * 0.6933594;
      auVar22._20_4_ = fStack_2c4c * 0.6933594;
      auVar22._24_4_ = fStack_2c48 * 0.6933594;
      auVar22._28_4_ = fStack_2c44;
      auVar7 = vsubps_avx(auVar4,auVar22);
      auVar21._4_4_ = fStack_2c5c * -0.00021219444;
      auVar21._0_4_ = local_2c60 * -0.00021219444;
      auVar21._8_4_ = fStack_2c58 * -0.00021219444;
      auVar21._12_4_ = fStack_2c54 * -0.00021219444;
      auVar21._16_4_ = fStack_2c50 * -0.00021219444;
      auVar21._20_4_ = fStack_2c4c * -0.00021219444;
      auVar21._24_4_ = fStack_2c48 * -0.00021219444;
      auVar21._28_4_ = fStack_2c44;
      auVar7 = vsubps_avx(auVar7,auVar21);
      local_3e00 = auVar7._0_4_;
      fStack_3dfc = auVar7._4_4_;
      fStack_3df8 = auVar7._8_4_;
      fStack_3df4 = auVar7._12_4_;
      fStack_3df0 = auVar7._16_4_;
      fStack_3dec = auVar7._20_4_;
      fStack_3de8 = auVar7._24_4_;
      fStack_3de4 = auVar7._28_4_;
      local_3f60 = CONCAT44((int)fStack_2c5c,(int)local_2c60);
      uStack_3f58 = CONCAT44((int)fStack_2c54,(int)fStack_2c58);
      uStack_3f50 = CONCAT44((int)fStack_2c4c,(int)fStack_2c50);
      uStack_3f48 = CONCAT44((int)fStack_2c44,(int)fStack_2c48);
      auVar26._8_8_ = uStack_3f58;
      auVar26._0_8_ = local_3f60;
      auVar25._8_8_ = 0x7f0000007f;
      auVar25._0_8_ = 0x7f0000007f;
      auVar5 = vpaddd_avx(auVar26,auVar25);
      auVar24._8_8_ = uStack_3f48;
      auVar24._0_8_ = uStack_3f50;
      auVar23._8_8_ = 0x7f0000007f;
      auVar23._0_8_ = 0x7f0000007f;
      auVar6 = vpaddd_avx(auVar24,auVar23);
      auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
      auVar6 = vpslld_avx(auVar6,ZEXT416(0x17));
      local_3e60 = auVar5._0_4_;
      fStack_3e5c = auVar5._4_4_;
      fStack_3e58 = auVar5._8_4_;
      fStack_3e54 = auVar5._12_4_;
      fStack_3e50 = auVar6._0_4_;
      fStack_3e4c = auVar6._4_4_;
      fStack_3e48 = auVar6._8_4_;
      local_3fc0 = CONCAT44(((((((fStack_3dfc * 0.00019875691 + 0.0013981999) * fStack_3dfc +
                                0.008333452) * fStack_3dfc + 0.041665796) * fStack_3dfc + 0.16666666
                              ) * fStack_3dfc + 0.5) * fStack_3dfc * fStack_3dfc + fStack_3dfc + 1.0
                            ) * fStack_3e5c,
                            ((((((local_3e00 * 0.00019875691 + 0.0013981999) * local_3e00 +
                                0.008333452) * local_3e00 + 0.041665796) * local_3e00 + 0.16666666)
                              * local_3e00 + 0.5) * local_3e00 * local_3e00 + local_3e00 + 1.0) *
                            local_3e60);
      uStack_3fb8 = CONCAT44(((((((fStack_3df4 * 0.00019875691 + 0.0013981999) * fStack_3df4 +
                                 0.008333452) * fStack_3df4 + 0.041665796) * fStack_3df4 +
                               0.16666666) * fStack_3df4 + 0.5) * fStack_3df4 * fStack_3df4 +
                              fStack_3df4 + 1.0) * fStack_3e54,
                             ((((((fStack_3df8 * 0.00019875691 + 0.0013981999) * fStack_3df8 +
                                 0.008333452) * fStack_3df8 + 0.041665796) * fStack_3df8 +
                               0.16666666) * fStack_3df8 + 0.5) * fStack_3df8 * fStack_3df8 +
                              fStack_3df8 + 1.0) * fStack_3e58);
      uStack_3fb0 = CONCAT44(((((((fStack_3dec * 0.00019875691 + 0.0013981999) * fStack_3dec +
                                 0.008333452) * fStack_3dec + 0.041665796) * fStack_3dec +
                               0.16666666) * fStack_3dec + 0.5) * fStack_3dec * fStack_3dec +
                              fStack_3dec + 1.0) * fStack_3e4c,
                             ((((((fStack_3df0 * 0.00019875691 + 0.0013981999) * fStack_3df0 +
                                 0.008333452) * fStack_3df0 + 0.041665796) * fStack_3df0 +
                               0.16666666) * fStack_3df0 + 0.5) * fStack_3df0 * fStack_3df0 +
                              fStack_3df0 + 1.0) * fStack_3e50);
      uStack_3fa8 = CONCAT44(fStack_3de4 + fStack_3de4 + 1.0,
                             ((((((fStack_3de8 * 0.00019875691 + 0.0013981999) * fStack_3de8 +
                                 0.008333452) * fStack_3de8 + 0.041665796) * fStack_3de8 +
                               0.16666666) * fStack_3de8 + 0.5) * fStack_3de8 * fStack_3de8 +
                              fStack_3de8 + 1.0) * fStack_3e48);
      *local_4208 = local_3fc0;
      local_4208[1] = uStack_3fb8;
      local_4208[2] = uStack_3fb0;
      local_4208[3] = uStack_3fa8;
      local_41f8 = local_41f8 + 4;
      local_4200 = local_4200 + 2;
      local_4208 = local_4208 + 4;
    }
    for (; local_4284 < in_ECX; local_4284 = local_4284 + 1) {
      uVar1 = *local_4200;
      auVar66._8_8_ = CONCAT44(uVar1,uVar1);
      auVar66._0_8_ = CONCAT44(uVar1,uVar1);
      auVar65._8_8_ = CONCAT44(uVar1,uVar1);
      auVar65._0_8_ = CONCAT44(uVar1,uVar1);
      auVar5 = vcmpps_avx(auVar66,ZEXT816(0),2);
      auVar52._8_8_ = 0x80000000800000;
      auVar52._0_8_ = 0x80000000800000;
      auVar6 = vmaxps_avx(auVar65,auVar52);
      auVar10 = vpsrld_avx(auVar6,ZEXT416(0x17));
      auVar57._8_8_ = 0x807fffff807fffff;
      auVar57._0_8_ = 0x807fffff807fffff;
      auVar6 = vpand_avx(auVar6,auVar57);
      auVar63._8_8_ = 0x3f0000003f000000;
      auVar63._0_8_ = 0x3f0000003f000000;
      auVar9 = vpor_avx(auVar6,auVar63);
      auVar53._8_8_ = 0x7f0000007f;
      auVar53._0_8_ = 0x7f0000007f;
      auVar6 = vpsubd_avx(auVar10,auVar53);
      auVar6 = vcvtdq2ps_avx(auVar6);
      local_a00 = auVar6._0_4_;
      fStack_9fc = auVar6._4_4_;
      fStack_9f8 = auVar6._8_4_;
      fStack_9f4 = auVar6._12_4_;
      local_aa0 = CONCAT44(fStack_9fc + 1.0,local_a00 + 1.0);
      uStack_a98._0_4_ = fStack_9f8 + 1.0;
      uStack_a98._4_4_ = fStack_9f4 + 1.0;
      auVar64._8_8_ = 0x3f3504f33f3504f3;
      auVar64._0_8_ = 0x3f3504f33f3504f3;
      auVar6 = vcmpps_avx(auVar9,auVar64,1);
      auVar10 = vpand_avx(auVar9,auVar6);
      auVar51._8_8_ = 0x3f8000003f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar9 = vsubps_avx(auVar9,auVar51);
      auVar56._8_8_ = 0x3f8000003f800000;
      auVar56._0_8_ = 0x3f8000003f800000;
      auVar6 = vpand_avx(auVar56,auVar6);
      auVar50._8_8_ = uStack_a98;
      auVar50._0_8_ = local_aa0;
      auVar6 = vsubps_avx(auVar50,auVar6);
      local_a20 = auVar9._0_4_;
      fStack_a1c = auVar9._4_4_;
      fStack_a18 = auVar9._8_4_;
      fStack_a14 = auVar9._12_4_;
      local_a30 = auVar10._0_4_;
      fStack_a2c = auVar10._4_4_;
      fStack_a28 = auVar10._8_4_;
      fStack_a24 = auVar10._12_4_;
      local_a20 = local_a20 + local_a30;
      fStack_a1c = fStack_a1c + fStack_a2c;
      fStack_a18 = fStack_a18 + fStack_a28;
      fStack_a14 = fStack_a14 + fStack_a24;
      local_620 = auVar6._0_4_;
      fStack_61c = auVar6._4_4_;
      fStack_618 = auVar6._8_4_;
      fStack_614 = auVar6._12_4_;
      local_ae0._4_4_ =
           fStack_61c * -0.00021219444 +
           ((((((((fStack_a1c * 0.070376836 + -0.1151461) * fStack_a1c + 0.116769984) * fStack_a1c +
                -0.12420141) * fStack_a1c + 0.14249323) * fStack_a1c + -0.16668057) * fStack_a1c +
             0.20000714) * fStack_a1c + -0.24999994) * fStack_a1c + 0.3333333) * fStack_a1c *
           fStack_a1c * fStack_a1c;
      local_ae0._0_4_ =
           local_620 * -0.00021219444 +
           ((((((((local_a20 * 0.070376836 + -0.1151461) * local_a20 + 0.116769984) * local_a20 +
                -0.12420141) * local_a20 + 0.14249323) * local_a20 + -0.16668057) * local_a20 +
             0.20000714) * local_a20 + -0.24999994) * local_a20 + 0.3333333) * local_a20 *
           local_a20 * local_a20;
      fStack_ad8 = fStack_618 * -0.00021219444 +
                   ((((((((fStack_a18 * 0.070376836 + -0.1151461) * fStack_a18 + 0.116769984) *
                         fStack_a18 + -0.12420141) * fStack_a18 + 0.14249323) * fStack_a18 +
                      -0.16668057) * fStack_a18 + 0.20000714) * fStack_a18 + -0.24999994) *
                    fStack_a18 + 0.3333333) * fStack_a18 * fStack_a18 * fStack_a18;
      fStack_ad4 = fStack_614 * -0.00021219444 +
                   ((((((((fStack_a14 * 0.070376836 + -0.1151461) * fStack_a14 + 0.116769984) *
                         fStack_a14 + -0.12420141) * fStack_a14 + 0.14249323) * fStack_a14 +
                      -0.16668057) * fStack_a14 + 0.20000714) * fStack_a14 + -0.24999994) *
                    fStack_a14 + 0.3333333) * fStack_a14 * fStack_a14 * fStack_a14;
      auVar59._4_4_ = fStack_a1c * fStack_a1c * 0.5;
      auVar59._0_4_ = local_a20 * local_a20 * 0.5;
      auVar59._8_4_ = fStack_a18 * fStack_a18 * 0.5;
      auVar59._12_4_ = fStack_a14 * fStack_a14 * 0.5;
      auVar6 = vsubps_avx(_local_ae0,auVar59);
      local_a50 = auVar6._0_4_;
      fStack_a4c = auVar6._4_4_;
      fStack_a48 = auVar6._8_4_;
      fStack_a44 = auVar6._12_4_;
      local_a60 = CONCAT44(fStack_61c * 0.6933594 + fStack_a1c + fStack_a4c,
                           local_620 * 0.6933594 + local_a20 + local_a50);
      uStack_a58._0_4_ = fStack_618 * 0.6933594 + fStack_a18 + fStack_a48;
      uStack_a58._4_4_ = fStack_614 * 0.6933594 + fStack_a14 + fStack_a44;
      auVar62._8_8_ = uStack_a58;
      auVar62._0_8_ = local_a60;
      auVar5 = vpor_avx(auVar62,auVar5);
      local_cb0 = (float)*local_41f8;
      fStack_cac = (float)((ulong)*local_41f8 >> 0x20);
      fStack_ca8 = (float)local_41f8[1];
      fStack_ca4 = (float)((ulong)local_41f8[1] >> 0x20);
      local_cc0 = auVar5._0_4_;
      fStack_cbc = auVar5._4_4_;
      fStack_cb8 = auVar5._8_4_;
      fStack_cb4 = auVar5._12_4_;
      local_c30 = CONCAT44(fStack_cac * fStack_cbc,local_cb0 * local_cc0);
      uStack_c28._0_4_ = fStack_ca8 * fStack_cb8;
      uStack_c28._4_4_ = fStack_ca4 * fStack_cb4;
      auVar47._8_8_ = uStack_c28;
      auVar47._0_8_ = local_c30;
      auVar46._8_8_ = 0x42b0c0a542b0c0a5;
      auVar46._0_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(auVar47,auVar46);
      auVar45._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar10 = vmaxps_avx(auVar5,auVar45);
      local_b70 = auVar10._0_4_;
      fStack_b6c = auVar10._4_4_;
      fStack_b68 = auVar10._8_4_;
      fStack_b64 = auVar10._12_4_;
      fVar71 = local_b70 * 1.442695 + 0.5;
      fVar72 = fStack_b6c * 1.442695 + 0.5;
      fVar73 = fStack_b68 * 1.442695 + 0.5;
      fVar74 = fStack_b64 * 1.442695 + 0.5;
      local_c50 = CONCAT44(fVar72,fVar71);
      uStack_c48._0_4_ = fVar73;
      uStack_c48._4_4_ = fVar74;
      local_c60 = CONCAT44((int)fVar72,(int)fVar71);
      uStack_c58._0_4_ = (int)fVar73;
      uStack_c58._4_4_ = (int)fVar74;
      auVar54._8_8_ = uStack_c58;
      auVar54._0_8_ = local_c60;
      auVar6 = vcvtdq2ps_avx(auVar54);
      auVar55._8_8_ = uStack_c48;
      auVar55._0_8_ = local_c50;
      auVar5 = vcmpps_avx(auVar55,auVar6,1);
      auVar58._8_8_ = 0x3f8000003f800000;
      auVar58._0_8_ = 0x3f8000003f800000;
      auVar5 = vpand_avx(auVar5,auVar58);
      auVar5 = vsubps_avx(auVar6,auVar5);
      local_6e0 = auVar5._0_4_;
      fStack_6dc = auVar5._4_4_;
      fStack_6d8 = auVar5._8_4_;
      fStack_6d4 = auVar5._12_4_;
      auVar61._4_4_ = fStack_6dc * 0.6933594;
      auVar61._0_4_ = local_6e0 * 0.6933594;
      auVar61._8_4_ = fStack_6d8 * 0.6933594;
      auVar61._12_4_ = fStack_6d4 * 0.6933594;
      auVar5 = vsubps_avx(auVar10,auVar61);
      auVar60._4_4_ = fStack_6dc * -0.00021219444;
      auVar60._0_4_ = local_6e0 * -0.00021219444;
      auVar60._8_4_ = fStack_6d8 * -0.00021219444;
      auVar60._12_4_ = fStack_6d4 * -0.00021219444;
      auVar5 = vsubps_avx(auVar5,auVar60);
      local_b90 = auVar5._0_4_;
      fStack_b8c = auVar5._4_4_;
      fStack_b88 = auVar5._8_4_;
      fStack_b84 = auVar5._12_4_;
      local_c60 = CONCAT44((int)fStack_6dc,(int)local_6e0);
      uStack_c58._0_4_ = (int)fStack_6d8;
      uStack_c58._4_4_ = (int)fStack_6d4;
      auVar49._8_8_ = uStack_c58;
      auVar49._0_8_ = local_c60;
      auVar48._8_8_ = 0x7f0000007f;
      auVar48._0_8_ = 0x7f0000007f;
      auVar5 = vpaddd_avx(auVar49,auVar48);
      auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
      local_bc0 = auVar5._0_4_;
      fStack_bbc = auVar5._4_4_;
      fStack_bb8 = auVar5._8_4_;
      fStack_bb4 = auVar5._12_4_;
      local_c90 = CONCAT44(((((((fStack_b8c * 0.00019875691 + 0.0013981999) * fStack_b8c +
                               0.008333452) * fStack_b8c + 0.041665796) * fStack_b8c + 0.16666666) *
                             fStack_b8c + 0.5) * fStack_b8c * fStack_b8c + fStack_b8c + 1.0) *
                           fStack_bbc,
                           ((((((local_b90 * 0.00019875691 + 0.0013981999) * local_b90 + 0.008333452
                               ) * local_b90 + 0.041665796) * local_b90 + 0.16666666) * local_b90 +
                            0.5) * local_b90 * local_b90 + local_b90 + 1.0) * local_bc0);
      uStack_c88 = CONCAT44(((((((fStack_b84 * 0.00019875691 + 0.0013981999) * fStack_b84 +
                                0.008333452) * fStack_b84 + 0.041665796) * fStack_b84 + 0.16666666)
                              * fStack_b84 + 0.5) * fStack_b84 * fStack_b84 + fStack_b84 + 1.0) *
                            fStack_bb4,
                            ((((((fStack_b88 * 0.00019875691 + 0.0013981999) * fStack_b88 +
                                0.008333452) * fStack_b88 + 0.041665796) * fStack_b88 + 0.16666666)
                              * fStack_b88 + 0.5) * fStack_b88 * fStack_b88 + fStack_b88 + 1.0) *
                            fStack_bb8);
      *local_4208 = local_c90;
      local_4208[1] = uStack_c88;
      local_41f8 = local_41f8 + 2;
      local_4200 = local_4200 + 1;
      local_4208 = local_4208 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}